

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int32_t xor_uint16(uint16_t *array_1,int32_t card_1,uint16_t *array_2,int32_t card_2,uint16_t *out)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  bVar3 = 0 < card_1;
  bVar4 = 0 < card_2;
  iVar6 = 0;
  iVar5 = 0;
  iVar8 = 0;
  if (bVar3 && bVar4) {
    iVar8 = 0;
    iVar5 = 0;
    iVar6 = 0;
    do {
      uVar1 = array_1[iVar8];
      uVar2 = array_2[iVar5];
      if (uVar1 == uVar2) {
        iVar8 = iVar8 + 1;
        iVar5 = iVar5 + 1;
      }
      else {
        if (uVar1 < uVar2) {
          out[iVar6] = uVar1;
          iVar8 = iVar8 + 1;
        }
        else {
          out[iVar6] = uVar2;
          iVar5 = iVar5 + 1;
        }
        iVar6 = iVar6 + 1;
      }
      bVar4 = iVar5 < card_2;
      bVar3 = iVar8 < card_1;
    } while ((iVar8 < card_1) && (iVar5 < card_2));
  }
  if (bVar3) {
    iVar7 = card_1 - iVar8;
    iVar5 = iVar8;
  }
  else {
    if (!bVar4) {
      return iVar6;
    }
    iVar7 = card_2 - iVar5;
    array_1 = array_2;
  }
  memcpy(out + iVar6,array_1 + iVar5,(long)iVar7 * 2);
  return iVar6 + iVar7;
}

Assistant:

int32_t xor_uint16(const uint16_t *array_1, int32_t card_1,
                   const uint16_t *array_2, int32_t card_2, uint16_t *out) {
    int32_t pos1 = 0, pos2 = 0, pos_out = 0;
    while (pos1 < card_1 && pos2 < card_2) {
        const uint16_t v1 = array_1[pos1];
        const uint16_t v2 = array_2[pos2];
        if (v1 == v2) {
            ++pos1;
            ++pos2;
            continue;
        }
        if (v1 < v2) {
            out[pos_out++] = v1;
            ++pos1;
        } else {
            out[pos_out++] = v2;
            ++pos2;
        }
    }
    if (pos1 < card_1) {
        const size_t n_elems = card_1 - pos1;
        memcpy(out + pos_out, array_1 + pos1, n_elems * sizeof(uint16_t));
        pos_out += (int32_t)n_elems;
    } else if (pos2 < card_2) {
        const size_t n_elems = card_2 - pos2;
        memcpy(out + pos_out, array_2 + pos2, n_elems * sizeof(uint16_t));
        pos_out += (int32_t)n_elems;
    }
    return pos_out;
}